

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::ClampEnd(ON_NurbsSurface *this,int dir,int end)

{
  bool bVar1;
  bool rc;
  undefined1 local_58 [8];
  ON_NurbsCurve crv;
  int end_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  crv.m_cv._0_4_ = end;
  crv.m_cv._4_4_ = dir;
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (crv.m_cv._4_4_ != 0) {
    crv.m_cv._4_4_ = 1;
  }
  ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_58);
  crv._32_8_ = this->m_knot[crv.m_cv._4_4_];
  ON_Internal_ConvertToCurve(this,crv.m_cv._4_4_,(ON_NurbsCurve *)local_58);
  bVar1 = ON_NurbsCurve::ClampEnd((ON_NurbsCurve *)local_58,(int)crv.m_cv);
  ON_Internal_ConvertFromCurve((ON_NurbsCurve *)local_58,crv.m_cv._4_4_,this);
  ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_58);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::ClampEnd(
          int dir,         // dir 0 = "s", 1 = "t"
          int end// 0 = clamp start, 1 = clamp end, 2 = clamp start and end
          )
{
  DestroySurfaceTree();
  if (dir)
    dir = 1;
  ON_NurbsCurve crv;
  crv.m_knot = m_knot[dir];
  ON_Internal_ConvertToCurve(*this,dir,crv);
  bool rc = crv.ClampEnd(end);
  ON_Internal_ConvertFromCurve(crv,dir,*this);
  return rc;
}